

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itread.c
# Opt level: O0

int readblock(DUMBFILE *f,readblock_crap *crap)

{
  int iVar1;
  int32 iVar2;
  DUMBFILE_SYSTEM *pDVar3;
  DUMBFILE *in_RSI;
  undefined8 in_RDI;
  int c;
  int32 size;
  DUMBFILE *in_stack_ffffffffffffffd8;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  
  iVar2 = (int32)((ulong)in_RDI >> 0x20);
  iVar1 = dumbfile_igetw(in_stack_ffffffffffffffd8);
  if (-1 < iVar1) {
    pDVar3 = (DUMBFILE_SYSTEM *)malloc((long)iVar1);
    in_RSI->dfs = pDVar3;
    if (in_RSI->dfs == (DUMBFILE_SYSTEM *)0x0) {
      iVar1 = -1;
    }
    else {
      iVar2 = dumbfile_getnc((char *)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),
                             iVar2,in_RSI);
      if (iVar2 < iVar1) {
        free(in_RSI->dfs);
        in_RSI->dfs = (DUMBFILE_SYSTEM *)0x0;
        iVar1 = -1;
      }
      else {
        in_RSI->file = in_RSI->dfs;
        in_RSI->pos = (long)&in_RSI->dfs->open + (long)iVar1;
        *(undefined4 *)&in_RSI[1].dfs = 8;
        iVar1 = 0;
      }
    }
  }
  return iVar1;
}

Assistant:

static int readblock(DUMBFILE *f, readblock_crap * crap)
{
	int32 size;
	int c;

	size = dumbfile_igetw(f);
	if (size < 0)
		return size;

	crap->sourcebuf = malloc(size);
	if (!crap->sourcebuf)
		return -1;

	c = dumbfile_getnc((char *)crap->sourcebuf, size, f);
	if (c < size) {
		free(crap->sourcebuf);
		crap->sourcebuf = NULL;
		return -1;
	}

	crap->sourcepos = crap->sourcebuf;
	crap->sourceend = crap->sourcebuf + size;
	crap->rembits = 8;
	return 0;
}